

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiffdec.c
# Opt level: O0

int ReadTIFF(uint8_t *data,size_t data_size,WebPPicture *pic,int keep_alpha,Metadata *metadata)

{
  ushort uVar1;
  int iVar2;
  TIFF *pTVar3;
  int in_ECX;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  uint8_t *tmp;
  uint32_t y;
  tdir_t dircount;
  int ok;
  int64_t alloc_size;
  uint32_t *raster;
  uint16_t *extra_samples_ptr;
  uint16_t extra_samples;
  uint16_t samples_per_px;
  uint64_t stride;
  uint32_t tile_height;
  uint32_t tile_width;
  uint32_t image_height;
  uint32_t image_width;
  TIFF *tif;
  MyData my_data;
  code *rgba;
  code *picture;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  TIFF *in_stack_ffffffffffffff58;
  uint local_9c;
  int local_94;
  short *local_80;
  short local_74;
  ushort local_72;
  uint64_t local_70;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  long local_58;
  undefined1 local_50 [16];
  undefined8 local_40;
  long local_38;
  int local_2c;
  long local_28;
  int local_c;
  
  local_40 = 0;
  local_72 = 0;
  local_74 = 0;
  local_80 = (short *)0x0;
  local_94 = 0;
  if ((((in_RDI == 0) || (in_RSI == 0)) || (0x7fffffff < in_RSI)) || (in_RDX == 0)) {
    local_c = 0;
  }
  else {
    rgba = MyClose;
    picture = MySize;
    local_38 = in_R8;
    local_2c = in_ECX;
    local_28 = in_RDX;
    local_58 = TIFFClientOpen("Memory","r",local_50,MyRead,MyRead,MySeek,MyClose,MySize,MyMapFile,
                              MyUnmapFile);
    if (local_58 == 0) {
      fprintf(_stderr,"Error! Cannot parse TIFF file\n");
      local_c = 0;
    }
    else {
      uVar1 = TIFFNumberOfDirectories(local_58);
      if (1 < uVar1) {
        fprintf(_stderr,
                "Warning: multi-directory TIFF files are not supported.\nOnly the first will be used, %d will be ignored.\n"
                ,(ulong)(uVar1 - 1));
      }
      iVar2 = TIFFGetFieldDefaulted(local_58,0x115,&local_72);
      if (iVar2 == 0) {
        fprintf(_stderr,"Error! Cannot retrieve TIFF samples-per-pixel info.\n");
      }
      else if ((2 < local_72) && (local_72 < 5)) {
        iVar2 = TIFFGetField(local_58,0x100,&local_5c);
        if ((iVar2 == 0) || (iVar2 = TIFFGetField(local_58,0x101,&local_60), iVar2 == 0)) {
          fprintf(_stderr,"Error! Cannot retrieve TIFF image dimensions.\n");
        }
        else {
          local_70 = (ulong)local_5c << 2;
          iVar2 = ImgIoUtilCheckSizeArgumentsOverflow(local_70,(ulong)local_60);
          if (iVar2 == 0) {
            fprintf(_stderr,"Error! TIFF image dimension (%d x %d) is too large.\n",(ulong)local_5c,
                    (ulong)local_60);
          }
          else {
            iVar2 = TIFFGetField(local_58,0x142,&local_64);
            if (((iVar2 == 0) || (iVar2 = TIFFGetField(local_58,0x143,&local_68), iVar2 == 0)) ||
               (((local_64 < 0x21 || (local_64 >> 1 <= local_5c)) &&
                (((local_68 < 0x21 || (local_68 >> 1 <= local_60)) &&
                 (iVar2 = ImgIoUtilCheckSizeArgumentsOverflow((ulong)local_64 << 2,(ulong)local_68),
                 iVar2 == 0)))))) {
              if ((local_72 < 4) ||
                 (iVar2 = TIFFGetField(local_58,0x152,&local_74,&local_80), iVar2 != 0)) {
                if (-1 < (long)(local_70 * local_60)) {
                  pTVar3 = (TIFF *)_TIFFmalloc(local_70 * local_60);
                  if (pTVar3 == (TIFF *)0x0) {
                    fprintf(_stderr,"Error allocating TIFF RGBA memory!\n");
                  }
                  else {
                    iVar2 = TIFFReadRGBAImageOriented(local_58,local_5c,local_60,pTVar3,1);
                    if (iVar2 != 0) {
                      *(uint *)(local_28 + 8) = local_5c;
                      *(uint *)(local_28 + 0xc) = local_60;
                      if (((local_74 == 1) && (local_80 != (short *)0x0)) && (*local_80 == 1)) {
                        in_stack_ffffffffffffff58 = pTVar3;
                        for (local_9c = 0; local_9c < local_60; local_9c = local_9c + 1) {
                          MultARGBRow((uint8_t *)picture,(int)((ulong)rgba >> 0x20));
                          in_stack_ffffffffffffff58 = in_stack_ffffffffffffff58 + local_70;
                        }
                      }
                      if (local_2c == 0) {
                        in_stack_ffffffffffffff54 =
                             WebPPictureImportRGBX((WebPPicture *)picture,(uint8_t *)rgba,0);
                        local_94 = in_stack_ffffffffffffff54;
                      }
                      else {
                        in_stack_ffffffffffffff54 =
                             WebPPictureImportRGBA((WebPPicture *)picture,(uint8_t *)rgba,0);
                        local_94 = in_stack_ffffffffffffff54;
                      }
                    }
                    _TIFFfree(pTVar3);
                  }
                  if (((local_94 != 0) && (local_38 != 0)) &&
                     (local_94 = ExtractMetadataFromTIFF
                                           (in_stack_ffffffffffffff58,
                                            (Metadata *)
                                            CONCAT44(in_stack_ffffffffffffff54,
                                                     in_stack_ffffffffffffff50)), local_94 == 0)) {
                    fprintf(_stderr,"Error extracting TIFF metadata!\n");
                    MetadataFree((Metadata *)0x108e70);
                    WebPPictureFree((WebPPicture *)0x108e7d);
                  }
                }
              }
              else {
                fprintf(_stderr,"Error! Cannot retrieve TIFF ExtraSamples info.\n");
              }
            }
            else {
              fprintf(_stderr,"Error! TIFF tile dimension (%d x %d) is too large.\n",(ulong)local_64
                      ,(ulong)local_68);
            }
          }
        }
      }
      TIFFClose(local_58);
      local_c = local_94;
    }
  }
  return local_c;
}

Assistant:

int ReadTIFF(const uint8_t* const data, size_t data_size,
             WebPPicture* const pic, int keep_alpha,
             Metadata* const metadata) {
  MyData my_data = { data, (toff_t)data_size, 0 };
  TIFF* tif;
  uint32_t image_width, image_height, tile_width, tile_height;
  uint64_t stride;
  uint16_t samples_per_px = 0;
  uint16_t extra_samples = 0;
  uint16_t* extra_samples_ptr = NULL;
  uint32_t* raster;
  int64_t alloc_size;
  int ok = 0;
  tdir_t dircount;

  if (data == NULL || data_size == 0 || data_size > INT_MAX || pic == NULL) {
    return 0;
  }

  tif = TIFFClientOpen("Memory", "r", &my_data,
                       MyRead, MyRead, MySeek, MyClose,
                       MySize, MyMapFile, MyUnmapFile);
  if (tif == NULL) {
    fprintf(stderr, "Error! Cannot parse TIFF file\n");
    return 0;
  }

  dircount = TIFFNumberOfDirectories(tif);
  if (dircount > 1) {
    fprintf(stderr, "Warning: multi-directory TIFF files are not supported.\n"
                    "Only the first will be used, %d will be ignored.\n",
                    dircount - 1);
  }
  if (!TIFFGetFieldDefaulted(tif, TIFFTAG_SAMPLESPERPIXEL, &samples_per_px)) {
    fprintf(stderr, "Error! Cannot retrieve TIFF samples-per-pixel info.\n");
    goto End;
  }
  if (samples_per_px < 3 || samples_per_px > 4) goto End;  // not supported

  if (!(TIFFGetField(tif, TIFFTAG_IMAGEWIDTH, &image_width) &&
        TIFFGetField(tif, TIFFTAG_IMAGELENGTH, &image_height))) {
    fprintf(stderr, "Error! Cannot retrieve TIFF image dimensions.\n");
    goto End;
  }
  stride = (uint64_t)image_width * sizeof(*raster);
  if (!ImgIoUtilCheckSizeArgumentsOverflow(stride, image_height)) {
    fprintf(stderr, "Error! TIFF image dimension (%d x %d) is too large.\n",
            image_width, image_height);
    goto End;
  }

  // According to spec, a tile can be bigger than the image. However it should
  // be a multiple of 16 and not way too large, so check that it's not more
  // than twice the image size, for dimensions above some arbitrary minimum
  // 32. We also check that they respect WebP's dimension and memory limit.
  // Note that a tile can be 6byte/px in some cases. Here we assume
  // 4byte/px with sizeof(*raster), to be conservative.
  if (TIFFGetField(tif, TIFFTAG_TILEWIDTH, &tile_width) &&
      TIFFGetField(tif, TIFFTAG_TILELENGTH, &tile_height)) {
    if ((tile_width > 32 && tile_width / 2 > image_width) ||
        (tile_height > 32 && tile_height / 2 > image_height) ||
        ImgIoUtilCheckSizeArgumentsOverflow(
            (uint64_t)tile_width * sizeof(*raster), tile_height)) {
      fprintf(stderr, "Error! TIFF tile dimension (%d x %d) is too large.\n",
              tile_width, tile_height);
      goto End;
    }
  }

  if (samples_per_px > 3 && !TIFFGetField(tif, TIFFTAG_EXTRASAMPLES,
                                          &extra_samples, &extra_samples_ptr)) {
    fprintf(stderr, "Error! Cannot retrieve TIFF ExtraSamples info.\n");
    goto End;
  }

  // _Tiffmalloc uses a signed type for size.
  alloc_size = (int64_t)(stride * image_height);
  if (alloc_size < 0 || alloc_size != (tsize_t)alloc_size) goto End;

  raster = (uint32_t*)_TIFFmalloc((tsize_t)alloc_size);
  if (raster != NULL) {
    if (TIFFReadRGBAImageOriented(tif, image_width, image_height, raster,
                                  ORIENTATION_TOPLEFT, 1)) {
      pic->width = image_width;
      pic->height = image_height;
      // TIFF data is ABGR
#ifdef WORDS_BIGENDIAN
      TIFFSwabArrayOfLong(raster, image_width * image_height);
#endif
      // if we have an alpha channel, we must un-multiply from rgbA to RGBA
      if (extra_samples == 1 && extra_samples_ptr != NULL &&
          extra_samples_ptr[0] == EXTRASAMPLE_ASSOCALPHA) {
        uint32_t y;
        uint8_t* tmp = (uint8_t*)raster;
        for (y = 0; y < image_height; ++y) {
          MultARGBRow(tmp, image_width);
          tmp += stride;
        }
      }
      ok = keep_alpha
         ? WebPPictureImportRGBA(pic, (const uint8_t*)raster, (int)stride)
         : WebPPictureImportRGBX(pic, (const uint8_t*)raster, (int)stride);
    }
    _TIFFfree(raster);
  } else {
    fprintf(stderr, "Error allocating TIFF RGBA memory!\n");
  }

  if (ok) {
    if (metadata != NULL) {
      ok = ExtractMetadataFromTIFF(tif, metadata);
      if (!ok) {
        fprintf(stderr, "Error extracting TIFF metadata!\n");
        MetadataFree(metadata);
        WebPPictureFree(pic);
      }
    }
  }
 End:
  TIFFClose(tif);
  return ok;
}